

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

void __thiscall
Js::CompoundString::CopyVirtual
          (CompoundString *this,char16 *buffer,StringCopyInfoStack *nestedStringTreeCopyInfos,
          byte recursionDepth)

{
  char16 *dst;
  Block *pointer;
  code *pcVar1;
  charcount_t cVar2;
  StringCopyInfo copyInfo;
  bool bVar3;
  charcount_t cVar4;
  CharCount CVar5;
  int iVar6;
  uint uVar7;
  undefined4 *puVar8;
  JavascriptString *pJVar9;
  char16 *pcVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  size_t sizeInWords;
  Block *pBVar12;
  uint uVar13;
  Block *this_00;
  StringCopyInfo local_b0;
  Type *local_98;
  CompoundString *local_90;
  undefined4 *local_88;
  undefined8 local_80;
  StringCopyInfoStack *local_78;
  uint local_6c;
  int local_68;
  charcount_t local_64;
  Block *local_60;
  char16 *local_58;
  uint local_4c;
  uint local_48;
  CharCount startIndex;
  CharCount CStack_40;
  CharCount copyCharLength;
  ulong local_38;
  
  local_80 = CONCAT71(in_register_00000009,recursionDepth);
  local_78 = nestedStringTreeCopyInfos;
  local_58 = buffer;
  bVar3 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x41e,"(!IsFinalized())","!IsFinalized()");
    if (!bVar3) goto LAB_00a09caf;
    *puVar8 = 0;
  }
  if (local_58 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x41f,"(buffer)","buffer");
    if (!bVar3) goto LAB_00a09caf;
    *puVar8 = 0;
  }
  cVar4 = JavascriptString::GetLength((JavascriptString *)this);
  if (cVar4 != 0) {
    if (cVar4 != 1) {
      local_64 = this->directCharLength;
      cVar2 = cVar4;
      if (local_64 != 0xffffffff) {
        cVar2 = local_64;
      }
      local_60 = (this->lastBlock).ptr;
      local_98 = &this->lastBlockInfo;
      pBVar12 = (Block *)(this->lastBlockInfo).buffer.ptr;
      local_90 = this;
      CVar5 = BlockInfo::PointerLength(local_98);
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      local_68 = (int)local_80 + 1;
      pJVar9 = (JavascriptString *)(ulong)CVar5;
      uVar11 = (ulong)cVar4;
      this_00 = local_60;
      local_88 = puVar8;
      local_48 = cVar2;
LAB_00a0955b:
      do {
        uVar13 = (uint)uVar11;
        local_38 = uVar11;
        if (uVar13 <= local_48) goto LAB_00a09942;
        uVar11 = (ulong)pJVar9 & 0xffffffff;
        while (iVar6 = (int)uVar11, iVar6 == 0) {
          if (this_00 == (Block *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x43b,"(block)","block");
            if (!bVar3) goto LAB_00a09caf;
            *puVar8 = 0;
          }
          this_00 = (this_00->previous).ptr;
          if (this_00 == (Block *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x43d,"(block)","block");
            if (!bVar3) goto LAB_00a09caf;
            *puVar8 = 0;
          }
          pBVar12 = (this_00->bufferOwner).ptr + 1;
          CVar5 = Block::PointerLength(this_00);
          uVar11 = (ulong)CVar5;
        }
        uVar13 = iVar6 - 1;
        pJVar9 = (JavascriptString *)(&pBVar12->bufferOwner)[(long)(ulong)uVar13].ptr;
        bVar3 = IsPackedInfo(pJVar9);
        puVar8 = local_88;
        if (!bVar3) {
          _CStack_40 = (JavascriptString *)(ulong)uVar13;
          pJVar9 = VarTo<Js::JavascriptString>(pJVar9);
          cVar4 = JavascriptString::GetLength(pJVar9);
          puVar8 = local_88;
          uVar13 = (uint)local_38;
          local_38 = (ulong)(uVar13 - cVar4);
          if (uVar13 < cVar4) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x465,"(remainingCharLengthToCopy >= copyCharLength)",
                                        "remainingCharLengthToCopy >= copyCharLength");
            if (!bVar3) goto LAB_00a09caf;
            *puVar8 = 0;
          }
          uVar11 = local_38 & 0xffffffff;
          if ((byte)local_80 == 3) {
            iVar6 = (*(pJVar9->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6a])(pJVar9);
            if ((char)iVar6 != '\0') {
              StringCopyInfo::StringCopyInfo(&local_b0,pJVar9,local_58 + uVar11);
              copyInfo.destinationBuffer = local_b0.destinationBuffer;
              copyInfo.sourceString = local_b0.sourceString;
              copyInfo.isInitialized = local_b0.isInitialized;
              copyInfo._17_7_ = local_b0._17_7_;
              StringCopyInfoStack::Push(local_78,copyInfo);
              pJVar9 = _CStack_40;
              uVar11 = local_38;
              goto LAB_00a0955b;
            }
          }
          else if (3 < (byte)local_80) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x470,"(recursionDepth <= MaxCopyRecursionDepth)",
                                        "recursionDepth <= MaxCopyRecursionDepth");
            if (!bVar3) goto LAB_00a09caf;
            *puVar8 = 0;
          }
          JavascriptString::Copy(pJVar9,local_58 + uVar11,local_78,(byte)local_68);
          pJVar9 = _CStack_40;
          uVar11 = local_38;
          goto LAB_00a0955b;
        }
        _CStack_40 = pJVar9;
        if (uVar13 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x445,"(pointerIndex != 0)","pointerIndex != 0");
          if (!bVar3) goto LAB_00a09caf;
          *puVar8 = 0;
        }
        pointer = (&pBVar12->bufferOwner)[(long)(ulong)(iVar6 - 2)].ptr;
        bVar3 = IsPackedInfo(pointer);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x449,"(!IsPackedInfo(pointer2))","!IsPackedInfo(pointer2)");
          if (!bVar3) goto LAB_00a09caf;
          *puVar8 = 0;
        }
        pJVar9 = VarTo<Js::JavascriptString>(pointer);
        UnpackSubstringInfo(_CStack_40,(void *)0x0,&local_4c,&startIndex);
        local_6c = local_4c;
        _CStack_40 = pJVar9;
        cVar4 = JavascriptString::GetLength(pJVar9);
        if (cVar4 < local_6c) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x459,"(startIndex <= s->GetLength())",
                                      "startIndex <= s->GetLength()");
          if (!bVar3) goto LAB_00a09caf;
          *puVar8 = 0;
        }
        CVar5 = startIndex;
        cVar4 = JavascriptString::GetLength(_CStack_40);
        if (cVar4 - local_4c < CVar5) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x45a,"(copyCharLength <= s->GetLength() - startIndex)",
                                      "copyCharLength <= s->GetLength() - startIndex");
          if (!bVar3) goto LAB_00a09caf;
          *puVar8 = 0;
        }
        if ((uint)local_38 < startIndex) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x45c,"(remainingCharLengthToCopy >= copyCharLength)",
                                      "remainingCharLengthToCopy >= copyCharLength");
          if (!bVar3) goto LAB_00a09caf;
          *puVar8 = 0;
        }
        local_38 = (ulong)((int)local_38 - startIndex);
        dst = local_58 + local_38;
        pcVar10 = JavascriptString::GetString(_CStack_40);
        JavascriptString::CopyHelper(dst,pcVar10 + local_4c,startIndex);
        pJVar9 = (JavascriptString *)(ulong)(iVar6 - 2);
        uVar11 = local_38;
      } while( true );
    }
    if (this->directCharLength != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x428,"(HasOnlyDirectChars())","HasOnlyDirectChars()");
      if (!bVar3) goto LAB_00a09caf;
      *puVar8 = 0;
    }
    if ((this->lastBlockInfo).charLength != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x429,"(LastBlockCharLength() == 1)","LastBlockCharLength() == 1"
                                 );
      if (!bVar3) goto LAB_00a09caf;
      *puVar8 = 0;
    }
    *local_58 = *(this->lastBlockInfo).buffer.ptr;
  }
  return;
LAB_00a09942:
  if (uVar13 != local_48) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x476,"(remainingCharLengthToCopy == directCharLength)",
                                "remainingCharLengthToCopy == directCharLength");
    if (!bVar3) goto LAB_00a09caf;
    *puVar8 = 0;
  }
  if (uVar13 != 0) {
    if ((int)pJVar9 == 0) {
      if (this_00 == (Block *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x47f,"(block)","block");
        if (!bVar3) goto LAB_00a09caf;
        *puVar8 = 0;
      }
      this_00 = (this_00->previous).ptr;
      if (this_00 == (Block *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x481,"(block)","block");
        if (!bVar3) goto LAB_00a09caf;
        *puVar8 = 0;
      }
      sizeInWords = (size_t)this_00->charLength;
    }
    else if (local_64 == 0xffffffff) {
      if (this_00 == local_60) {
        sizeInWords = (size_t)(local_90->lastBlockInfo).charLength;
      }
      else {
        sizeInWords = (size_t)this_00->charLength;
      }
    }
    else {
      sizeInWords = uVar11 & 0xffffffff;
      _CStack_40 = pJVar9;
      if (this_00 != (Block *)0x0) {
        sizeInWords = uVar11 & 0xffffffff;
        pBVar12 = this_00;
        while (pBVar12 = (pBVar12->previous).ptr, pBVar12 != (Block *)0x0) {
          uVar13 = pBVar12->charLength;
          if ((uint)sizeInWords < uVar13) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x494,"(blockCharLength >= previousBlock->CharLength())",
                                        "blockCharLength >= previousBlock->CharLength()");
            if (!bVar3) goto LAB_00a09caf;
            *puVar8 = 0;
            uVar13 = pBVar12->charLength;
          }
          sizeInWords = (size_t)((uint)sizeInWords - uVar13);
        }
      }
      CVar5 = Block::PointerLengthFromCharLength((CharCount)sizeInWords);
      if (CVar5 != CStack_40) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x498,
                                    "(Block::PointerLengthFromCharLength(blockCharLength) == pointerIndex)"
                                    ,
                                    "Block::PointerLengthFromCharLength(blockCharLength) == pointerIndex"
                                   );
        if (!bVar3) goto LAB_00a09caf;
        *puVar8 = 0;
      }
    }
    if (this_00 == local_60) {
      pBVar12 = (Block *)(local_98->buffer).ptr;
    }
    else {
      pBVar12 = (this_00->bufferOwner).ptr + 1;
    }
    do {
      uVar13 = (uint)sizeInWords;
      if (uVar13 != 0) {
        uVar7 = (uint)local_38;
        local_38 = (ulong)(uVar7 - uVar13);
        if (uVar7 < uVar13) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x4a1,"(remainingCharLengthToCopy >= blockCharLength)",
                                      "remainingCharLengthToCopy >= blockCharLength");
          if (!bVar3) goto LAB_00a09caf;
          *puVar8 = 0;
        }
        uVar11 = local_38;
        js_wmemcpy_s(local_58 + local_38,sizeInWords,(char16 *)pBVar12,sizeInWords);
        if ((int)uVar11 == 0) break;
      }
      if (this_00 == (Block *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x4a9,"(block)","block");
        if (!bVar3) goto LAB_00a09caf;
        *puVar8 = 0;
      }
      this_00 = (this_00->previous).ptr;
      if (this_00 == (Block *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x4ab,"(block)","block");
        if (!bVar3) goto LAB_00a09caf;
        *puVar8 = 0;
      }
      pBVar12 = (this_00->bufferOwner).ptr + 1;
      sizeInWords = (size_t)this_00->charLength;
    } while( true );
  }
  if (this_00 == (Block *)0x0) {
    return;
  }
  while( true ) {
    do {
      this_00 = (this_00->previous).ptr;
      if (this_00 == (Block *)0x0) {
        return;
      }
    } while (this_00->charLength == 0);
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x4ba,"(block->CharLength() == 0)","block->CharLength() == 0");
    if (!bVar3) break;
    *puVar8 = 0;
  }
LAB_00a09caf:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void CompoundString::CopyVirtual(
        _Out_writes_(m_charLength) char16 *const buffer,
        StringCopyInfoStack &nestedStringTreeCopyInfos,
        const byte recursionDepth)
    {
        Assert(!IsFinalized());
        Assert(buffer);

        const CharCount totalCharLength = GetLength();
        switch(totalCharLength)
        {
            case 0:
                return;

            case 1:
                Assert(HasOnlyDirectChars());
                Assert(LastBlockCharLength() == 1);

                buffer[0] = LastBlockChars()[0];
                return;
        }

        // Copy buffers from string pointers
        const bool hasOnlyDirectChars = HasOnlyDirectChars();
        const CharCount directCharLength = hasOnlyDirectChars ? totalCharLength : this->directCharLength;
        CharCount remainingCharLengthToCopy = totalCharLength;
        const Block *const lastBlock = this->lastBlock;
        const Block *block = lastBlock;
        Field(void*) const *blockPointers = LastBlockPointers();
        CharCount pointerIndex = LastBlockPointerLength();
        while(remainingCharLengthToCopy > directCharLength)
        {
            while(pointerIndex == 0)
            {
                Assert(block);
                block = block->Previous();
                Assert(block);
                blockPointers = (Field(void*) const *)block->Pointers();
                pointerIndex = block->PointerLength();
            }

            void *const pointer = blockPointers[--pointerIndex];
            if(IsPackedInfo(pointer))
            {
                Assert(pointerIndex != 0);
                void *pointer2 = blockPointers[--pointerIndex];
                JavascriptString *s;
    #if defined(TARGET_64)
                Assert(!IsPackedInfo(pointer2));
    #else
                if(IsPackedInfo(pointer2))
                {
                    Assert(pointerIndex != 0);
                    s = VarTo<JavascriptString>(blockPointers[--pointerIndex]);
                }
                else
    #endif
                {
                    s = VarTo<JavascriptString>(pointer2);
                    pointer2 = nullptr;
                }

                CharCount startIndex, copyCharLength;
                UnpackSubstringInfo(pointer, pointer2, &startIndex, &copyCharLength);
                Assert(startIndex <= s->GetLength());
                Assert(copyCharLength <= s->GetLength() - startIndex);

                Assert(remainingCharLengthToCopy >= copyCharLength);
                remainingCharLengthToCopy -= copyCharLength;
                CopyHelper(&buffer[remainingCharLengthToCopy], &s->GetString()[startIndex], copyCharLength);
            }
            else
            {
                JavascriptString *const s = VarTo<JavascriptString>(pointer);
                const CharCount copyCharLength = s->GetLength();

                Assert(remainingCharLengthToCopy >= copyCharLength);
                remainingCharLengthToCopy -= copyCharLength;
                if(recursionDepth == MaxCopyRecursionDepth && s->IsTree())
                {
                    // Don't copy nested string trees yet, as that involves a recursive call, and the recursion can become
                    // excessive. Just collect the nested string trees and the buffer location where they should be copied, and
                    // the caller can deal with those after returning.
                    nestedStringTreeCopyInfos.Push(StringCopyInfo(s, &buffer[remainingCharLengthToCopy]));
                }
                else
                {
                    Assert(recursionDepth <= MaxCopyRecursionDepth);
                    s->Copy(&buffer[remainingCharLengthToCopy], nestedStringTreeCopyInfos, recursionDepth + 1);
                }
            }
        }

        Assert(remainingCharLengthToCopy == directCharLength);
        if(remainingCharLengthToCopy != 0)
        {
            // Determine the number of direct chars in the current block
            CharCount blockCharLength;
            if(pointerIndex == 0)
            {
                // The string switched to pointer mode at the beginning of the current block, or the string never switched to
                // pointer mode and the last block is empty. In either case, direct chars span to the end of the previous block.
                Assert(block);
                block = block->Previous();
                Assert(block);
                blockCharLength = block->CharLength();
            }
            else if(hasOnlyDirectChars)
            {
                // The string never switched to pointer mode, so the current block's char length is where direct chars end
                blockCharLength = block == lastBlock ? LastBlockCharLength() : block->CharLength();
            }
            else
            {
                // The string switched to pointer mode somewhere in the middle of the current block. To determine where direct
                // chars end in this block, all previous blocks are scanned and their char lengths discounted.
                blockCharLength = remainingCharLengthToCopy;
                if(block)
                {
                    for(const Block *previousBlock = block->Previous();
                        previousBlock;
                        previousBlock = previousBlock->Previous())
                    {
                        Assert(blockCharLength >= previousBlock->CharLength());
                        blockCharLength -= previousBlock->CharLength();
                    }
                }
                Assert(Block::PointerLengthFromCharLength(blockCharLength) == pointerIndex);
            }

            // Copy direct chars
            const char16 *blockChars = block == lastBlock ? LastBlockChars() : block->Chars();
            while(true)
            {
                if(blockCharLength != 0)
                {
                    Assert(remainingCharLengthToCopy >= blockCharLength);
                    remainingCharLengthToCopy -= blockCharLength;
                    // SWB: this is copying "direct chars" and there should be no pointers here. No write barrier needed.
                    js_wmemcpy_s(&buffer[remainingCharLengthToCopy], blockCharLength, blockChars, blockCharLength);
                    if(remainingCharLengthToCopy == 0)
                        break;
                }

                Assert(block);
                block = block->Previous();
                Assert(block);
                blockChars = block->Chars();
                blockCharLength = block->CharLength();
            }
        }

    #if DBG
        // Verify that all nonempty blocks have been visited
        if(block)
        {
            while(true)
            {
                block = block->Previous();
                if(!block)
                    break;
                Assert(block->CharLength() == 0);
            }
        }
    #endif

        Assert(remainingCharLengthToCopy == 0);
    }